

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O3

int wally_witness_multisig_from_bytes
              (uchar *script,size_t script_len,uchar *bytes,size_t bytes_len,uint32_t *sighash,
              size_t sighash_len,uint32_t flags,wally_tx_witness_stack **witness)

{
  undefined4 in_EAX;
  int iVar1;
  int iVar2;
  uchar *bytes_out;
  size_t size;
  undefined1 auVar3 [16];
  size_t scriptsig_len;
  size_t local_38;
  
  auVar3._0_4_ = -(uint)(script == (uchar *)0x0);
  auVar3._4_4_ = -(uint)(bytes == (uchar *)0x0);
  auVar3._8_4_ = -(uint)(sighash == (uint32_t *)0x0);
  auVar3._12_4_ = -(uint)(witness == (wally_tx_witness_stack **)0x0);
  iVar1 = movmskps(in_EAX,auVar3);
  iVar2 = -2;
  if ((((iVar1 == 0) && (script_len != 0)) && (bytes_len != 0)) &&
     ((sighash_len != 0 && ((byte)(*script + 0xaf) < 0x10)))) {
    size = (ulong)(*script - 0x50) * 0x4a + script_len;
    local_38 = sighash_len;
    bytes_out = (uchar *)wally_malloc(size);
    if (bytes_out == (uchar *)0x0) {
      iVar2 = -3;
    }
    else {
      iVar2 = wally_scriptsig_multisig_from_bytes
                        (script,script_len,bytes,bytes_len,sighash,local_38,flags,bytes_out,size,
                         &scriptsig_len);
      if (iVar2 == 0) {
        iVar2 = scriptsig_to_witness(bytes_out,scriptsig_len,witness);
      }
      clear_and_free(bytes_out,scriptsig_len);
    }
  }
  return iVar2;
}

Assistant:

int wally_witness_multisig_from_bytes(
    const unsigned char *script,
    size_t script_len,
    const unsigned char *bytes,
    size_t bytes_len,
    const uint32_t *sighash,
    size_t sighash_len,
    uint32_t flags,
    struct wally_tx_witness_stack **witness)
{
    unsigned char *scriptsig = NULL;
    int ret = WALLY_OK;
    size_t scriptsig_len, n_sigs, buf_len;

    if (!script || !script_len || !bytes || !bytes_len || !sighash || !sighash_len ||
        !witness || !script_is_op_n(script[0], false, &n_sigs))
        return WALLY_EINVAL;

    buf_len = n_sigs * (EC_SIGNATURE_DER_MAX_LEN + 2) + script_len;
    if (!(scriptsig = wally_malloc(buf_len)))
        return WALLY_ENOMEM;

    ret = wally_scriptsig_multisig_from_bytes(script, script_len,
                                              bytes, bytes_len,
                                              sighash, sighash_len, flags,
                                              scriptsig, buf_len, &scriptsig_len);
    if (ret == WALLY_OK)
        ret = scriptsig_to_witness(scriptsig, scriptsig_len, witness);

    clear_and_free(scriptsig, scriptsig_len);
    return ret;
}